

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int little2_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  byte *pbVar5;
  undefined1 uVar6;
  byte *pbVar7;
  char cVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  byte bVar12;
  long lVar13;
  bool bVar14;
  
  if (end <= ptr) {
    return -4;
  }
  uVar9 = (long)end - (long)ptr & 0xfffffffffffffffe;
  pcVar4 = ptr + uVar9;
  if (uVar9 == 0) {
    pcVar4 = end;
  }
  bVar14 = ((long)end - (long)ptr & 1U) != 0;
  if (!bVar14) {
    pcVar4 = end;
  }
  if (bVar14 && uVar9 == 0) {
    return -1;
  }
  bVar1 = ptr[1];
  if (bVar1 < 0xdc) {
    uVar6 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar6 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_004e1540:
        uVar6 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar6 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_004e1540;
    uVar6 = 0;
  }
  switch(uVar6) {
  case 0:
  case 1:
  case 8:
switchD_004e155f_caseD_0:
    *nextTokPtr = ptr;
    return 0;
  case 2:
    pbVar7 = (byte *)(ptr + 2);
    lVar10 = (long)pcVar4 - (long)pbVar7;
    if (lVar10 < 2) {
      return -1;
    }
    bVar1 = ptr[3];
    if (bVar1 < 0xdc) {
      cVar8 = '\a';
      if (3 < bVar1 - 0xd8) {
        if (bVar1 == 0) {
          cVar8 = *(char *)((long)enc[1].scanners + (ulong)*pbVar7);
        }
        else {
LAB_004e17e9:
          cVar8 = '\x1d';
        }
      }
    }
    else if (bVar1 - 0xdc < 4) {
      cVar8 = '\b';
    }
    else {
      if ((bVar1 != 0xff) || (*pbVar7 < 0xfe)) goto LAB_004e17e9;
      cVar8 = '\0';
    }
    switch(cVar8) {
    case '\x05':
    case '\b':
    case '\t':
    case '\n':
    case '\v':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x12':
    case '\x13':
    case '\x14':
    case '\x15':
    case '\x17':
      break;
    case '\a':
switchD_004e180c_caseD_7:
      if (lVar10 < 4) {
        return -2;
      }
      break;
    case '\x0f':
      iVar3 = little2_scanPi(enc,ptr + 4,pcVar4,nextTokPtr);
      return iVar3;
    case '\x10':
      pbVar7 = (byte *)(ptr + 4);
      if ((long)pcVar4 - (long)pbVar7 < 2) {
        return -1;
      }
      bVar1 = ptr[5];
      if (bVar1 < 0xdc) {
        cVar8 = '\a';
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            cVar8 = *(char *)((long)enc[1].scanners + (ulong)*pbVar7);
          }
          else {
LAB_004e1d10:
            cVar8 = '\x1d';
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        cVar8 = '\b';
      }
      else {
        if ((bVar1 != 0xff) || (*pbVar7 < 0xfe)) goto LAB_004e1d10;
        cVar8 = '\0';
      }
      if (cVar8 == '\x14') {
        pbVar5 = (byte *)(ptr + 6);
        if ((long)pcVar4 - (long)pbVar5 < 0xc) {
          return -1;
        }
        lVar10 = 0;
        while ((pbVar5[1] == 0 && (*pbVar5 == (&big2_scanCdataSection_CDATA_LSQB)[lVar10]))) {
          lVar10 = lVar10 + 1;
          pbVar5 = pbVar5 + 2;
          if (lVar10 == 6) {
            *nextTokPtr = ptr + 0x12;
            return 8;
          }
        }
LAB_004e1d82:
        *nextTokPtr = (char *)pbVar5;
        return 0;
      }
      if (cVar8 == '\x1b') {
        iVar3 = little2_scanComment(enc,ptr + 6,pcVar4,nextTokPtr);
        return iVar3;
      }
      break;
    case '\x11':
      pbVar7 = (byte *)(ptr + 4);
      lVar10 = (long)pcVar4 - (long)pbVar7;
      if (lVar10 < 2) {
        return -1;
      }
      bVar1 = ptr[5];
      if (bVar1 < 0xdc) {
        bVar12 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            bVar12 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar7);
          }
          else {
LAB_004e1b71:
            bVar12 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        bVar12 = 8;
      }
      else {
        if ((bVar1 != 0xff) || (*pbVar7 < 0xfe)) goto LAB_004e1b71;
        bVar12 = 0;
      }
      if (0x15 < bVar12) {
        if (((bVar12 == 0x16) || (bVar12 == 0x18)) ||
           ((bVar12 == 0x1d &&
            ((*(uint *)((long)namingBitmap +
                       (ulong)(*pbVar7 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
              >> (*pbVar7 & 0x1f) & 1) != 0)))) {
          if ((long)(pcVar4 + (-6 - (long)ptr)) < 2) {
            return -1;
          }
          lVar13 = 6;
          lVar10 = 0;
LAB_004e1c3c:
          bVar1 = ptr[lVar13 + 1];
          if (bVar1 < 0xdc) {
            uVar6 = 7;
            if (3 < bVar1 - 0xd8) {
              if (bVar1 == 0) {
                uVar6 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[lVar13]);
              }
              else {
LAB_004e1c94:
                uVar6 = 0x1d;
              }
            }
          }
          else if (bVar1 - 0xdc < 4) {
            uVar6 = 8;
          }
          else {
            if ((bVar1 != 0xff) || ((byte)ptr[lVar13] < 0xfe)) goto LAB_004e1c94;
            uVar6 = 0;
          }
          switch(uVar6) {
          case 6:
            if (pcVar4 + (lVar10 - (long)ptr) == (char *)0x8) {
              return -2;
            }
            break;
          case 7:
            if ((long)(pcVar4 + (lVar10 - (long)ptr) + -6) < 4) {
              return -2;
            }
            break;
          case 9:
          case 10:
          case 0x15:
            pcVar4 = pcVar4 + (lVar10 - (long)ptr) + -8;
            if ((long)pcVar4 < 2) {
              return -1;
            }
            ptr = ptr + (8 - lVar10);
            goto LAB_004e1da2;
          case 0xb:
            pbVar5 = (byte *)(ptr + (8 - lVar10));
            goto LAB_004e1ed3;
          case 0x16:
          case 0x18:
          case 0x19:
          case 0x1a:
          case 0x1b:
            goto switchD_004e1cb0_caseD_16;
          case 0x1d:
            if ((*(uint *)((long)namingBitmap +
                          (ulong)((byte)ptr[lVar13] >> 3 & 0x1c |
                                 (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
                 ((byte)ptr[lVar13] & 0x1f) & 1) != 0) goto switchD_004e1cb0_caseD_16;
          }
          ptr = ptr + (6 - lVar10);
          goto switchD_004e155f_caseD_0;
        }
        break;
      }
      if (bVar12 == 5) break;
      if (bVar12 != 6) {
        if (bVar12 != 7) break;
        goto switchD_004e180c_caseD_7;
      }
    case '\x06':
      if (lVar10 == 2) {
        return -2;
      }
      break;
    case '\x16':
    case '\x18':
switchD_004e180c_caseD_16:
      if ((long)(pcVar4 + (-4 - (long)ptr)) < 2) {
        return -1;
      }
      lVar13 = 4;
      lVar10 = 0;
LAB_004e183d:
      bVar1 = ptr[lVar13 + 1];
      if (bVar1 < 0xdc) {
        uVar6 = 7;
        if (3 < bVar1 - 0xd8) {
          if (bVar1 == 0) {
            uVar6 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[lVar13]);
          }
          else {
LAB_004e1895:
            uVar6 = 0x1d;
          }
        }
      }
      else if (bVar1 - 0xdc < 4) {
        uVar6 = 8;
      }
      else {
        if ((bVar1 != 0xff) || ((byte)ptr[lVar13] < 0xfe)) goto LAB_004e1895;
        uVar6 = 0;
      }
      switch(uVar6) {
      case 6:
        if (pcVar4 + (lVar10 - (long)ptr) == (char *)0x6) {
          return -2;
        }
        break;
      case 7:
        if ((long)(pcVar4 + (lVar10 - (long)ptr) + -4) < 4) {
          return -2;
        }
        break;
      case 9:
      case 10:
      case 0x15:
        if ((long)(pcVar4 + (lVar10 - (long)ptr) + -6) < 2) {
          return -1;
        }
        lVar13 = lVar10 - (long)ptr;
        ptr = ptr + (6 - lVar10);
        pcVar11 = pcVar4 + lVar13 + -8;
        goto LAB_004e1a4b;
      case 0xb:
        ptr = ptr + (4 - lVar10);
        goto switchD_004e1ab2_caseD_b;
      case 0x11:
        ptr = ptr + (4 - lVar10);
        goto switchD_004e1ab2_caseD_11;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_004e18b1_caseD_16;
      case 0x1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)ptr[lVar13] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)ptr[lVar13] & 0x1f) & 1) != 0) goto switchD_004e18b1_caseD_16;
      }
      ptr = ptr + (4 - lVar10);
      goto switchD_004e155f_caseD_0;
    default:
      if ((cVar8 == '\x1d') &&
         ((*(uint *)((long)namingBitmap +
                    (ulong)(*pbVar7 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
           (*pbVar7 & 0x1f) & 1) != 0)) goto switchD_004e180c_caseD_16;
    }
    goto switchD_004e180c_caseD_5;
  case 3:
    iVar3 = little2_scanRef(enc,ptr + 2,pcVar4,nextTokPtr);
    return iVar3;
  case 4:
    pbVar5 = (byte *)(ptr + 2);
    if ((long)pcVar4 - (long)pbVar5 < 2) {
      return -5;
    }
    if ((ptr[3] == '\0') && (*pbVar5 == 0x5d)) {
      pcVar11 = ptr + 4;
      if ((long)pcVar4 - (long)pcVar11 < 2) {
        return -5;
      }
      if ((ptr[5] == '\0') && (*pcVar11 == '>')) {
        *nextTokPtr = pcVar11;
        return 0;
      }
    }
    break;
  case 5:
    if ((long)pcVar4 - (long)ptr < 2) {
      return -2;
    }
  default:
    pbVar5 = (byte *)(ptr + 2);
    break;
  case 6:
    if ((long)pcVar4 - (long)ptr < 3) {
      return -2;
    }
    pbVar5 = (byte *)(ptr + 3);
    break;
  case 7:
    if ((long)pcVar4 - (long)ptr < 4) {
      return -2;
    }
    pbVar5 = (byte *)(ptr + 4);
    break;
  case 9:
    pbVar5 = (byte *)(ptr + 2);
    if (1 < (long)pcVar4 - (long)pbVar5) {
      if (ptr[3] == '\0') {
        bVar14 = *(char *)((long)enc[1].scanners + (ulong)*pbVar5) == '\n';
      }
      else {
        bVar14 = false;
      }
      if (bVar14) {
        pbVar5 = (byte *)(ptr + 4);
      }
      *nextTokPtr = (char *)pbVar5;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 2;
    return 7;
  }
joined_r0x004e164b:
  pbVar7 = pbVar5;
  lVar10 = (long)pcVar4 - (long)pbVar7;
  if (lVar10 < 2) {
    *nextTokPtr = (char *)pbVar7;
    return 6;
  }
  bVar1 = pbVar7[1];
  if (bVar1 < 0xdc) {
    uVar6 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar6 = *(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar7);
      }
      else {
LAB_004e16af:
        uVar6 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar6 = 8;
  }
  else {
    if ((bVar1 != 0xff) || (*pbVar7 < 0xfe)) goto LAB_004e16af;
    uVar6 = 0;
  }
  switch(uVar6) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 8:
  case 9:
  case 10:
    break;
  case 4:
    if (lVar10 < 4) break;
    pbVar5 = pbVar7 + 2;
    if ((pbVar7[3] != 0) || (*pbVar5 != 0x5d)) goto joined_r0x004e164b;
    if (lVar10 < 6) break;
    if ((pbVar7[5] != 0) || (pbVar7[4] != 0x3e)) goto joined_r0x004e164b;
    pbVar7 = pbVar7 + 4;
switchD_004e180c_caseD_5:
    *nextTokPtr = (char *)pbVar7;
    return 0;
  default:
    pbVar5 = pbVar7 + 2;
    goto joined_r0x004e164b;
  case 6:
    if (lVar10 != 2) {
      pbVar5 = pbVar7 + 3;
      goto joined_r0x004e164b;
    }
    break;
  case 7:
    if (3 < lVar10) {
      pbVar5 = pbVar7 + 4;
      goto joined_r0x004e164b;
    }
  }
  *nextTokPtr = (char *)pbVar7;
  return 6;
switchD_004e18b1_caseD_16:
  lVar2 = lVar10 - (long)ptr;
  lVar10 = lVar10 + -2;
  lVar13 = lVar13 + 2;
  if ((long)(pcVar4 + lVar2 + -6) < 2) {
    return -1;
  }
  goto LAB_004e183d;
LAB_004e1a4b:
  bVar1 = ((byte *)ptr)[1];
  if (bVar1 < 0xdc) {
    uVar6 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        uVar6 = *(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_004e1a9a:
        uVar6 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    uVar6 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_004e1a9a;
    uVar6 = 0;
  }
  switch(uVar6) {
  default:
    goto switchD_004e155f_caseD_0;
  case 6:
    if (pcVar11 == (char *)0x0) {
      return -2;
    }
    goto switchD_004e155f_caseD_0;
  case 7:
    if (pcVar11 + 2 < (char *)0x4) {
      return -2;
    }
    goto switchD_004e155f_caseD_0;
  case 9:
  case 10:
  case 0x15:
    goto switchD_004e1ab2_caseD_9;
  case 0xb:
    goto switchD_004e1ab2_caseD_b;
  case 0x11:
    break;
  case 0x16:
  case 0x18:
    goto switchD_004e1ab2_caseD_16;
  case 0x1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
         ((byte)*ptr & 0x1f) & 1) == 0) goto switchD_004e155f_caseD_0;
switchD_004e1ab2_caseD_16:
    iVar3 = little2_scanAtts(enc,(char *)((byte *)ptr + 2),pcVar4,nextTokPtr);
    return iVar3;
  }
switchD_004e1ab2_caseD_11:
  pbVar5 = (byte *)ptr + 2;
  if ((long)pcVar4 - (long)pbVar5 < 2) {
    return -1;
  }
  if ((((byte *)ptr)[3] == 0) && (*pbVar5 == 0x3e)) {
    *nextTokPtr = (char *)((byte *)ptr + 4);
    return 4;
  }
  goto LAB_004e1d82;
switchD_004e1ab2_caseD_9:
  ptr = (char *)((byte *)ptr + 2);
  bVar14 = (long)pcVar11 < 2;
  pcVar11 = pcVar11 + -2;
  if (bVar14) {
    return -1;
  }
  goto LAB_004e1a4b;
switchD_004e1cb0_caseD_16:
  lVar2 = lVar10 - (long)ptr;
  lVar10 = lVar10 + -2;
  lVar13 = lVar13 + 2;
  if ((long)(pcVar4 + lVar2 + -8) < 2) {
    return -1;
  }
  goto LAB_004e1c3c;
LAB_004e1da2:
  bVar1 = ((byte *)ptr)[1];
  if (bVar1 < 0xdc) {
    bVar12 = 7;
    if (3 < bVar1 - 0xd8) {
      if (bVar1 == 0) {
        bVar12 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      }
      else {
LAB_004e1df8:
        bVar12 = 0x1d;
      }
    }
  }
  else if (bVar1 - 0xdc < 4) {
    bVar12 = 8;
  }
  else {
    if ((bVar1 != 0xff) || ((byte)*ptr < 0xfe)) goto LAB_004e1df8;
    bVar12 = 0;
  }
  if ((1 < bVar12 - 9) && (bVar12 != 0x15)) {
    if (bVar12 == 0xb) {
      pbVar5 = (byte *)ptr + 2;
LAB_004e1ed3:
      *nextTokPtr = (char *)pbVar5;
      return 5;
    }
    goto switchD_004e155f_caseD_0;
  }
  ptr = (char *)((byte *)ptr + 2);
  pcVar4 = pcVar4 + -2;
  if ((long)pcVar4 < 2) {
    return -1;
  }
  goto LAB_004e1da2;
switchD_004e1ab2_caseD_b:
  *nextTokPtr = (char *)((byte *)ptr + 2);
  return 2;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (HAS_CHARS(enc, ptr, end, 3)) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}